

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void render_element(element_t *element,render_context_t *context,render_state_t *state)

{
  element *peVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  render_state **pprVar4;
  undefined8 context_00;
  _Bool _Var5;
  int iVar6;
  string_t *psVar7;
  render_state *prVar8;
  element_t *element_00;
  plutovg_surface_t *surface;
  view_position_t *position;
  bool bVar9;
  char *pcVar10;
  plutovg_path_t *path;
  char *end;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float x;
  length_type_t lStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  length_t x_1;
  length_t y;
  float local_d8;
  float local_c8;
  float local_b8;
  length_t ry;
  char *it;
  float fStack_90;
  float local_8c;
  float local_88;
  float local_84;
  length_t rx;
  render_state_t new_state;
  
  switch(element->id) {
  case 1:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    it._0_4_ = 0.0;
    it._4_4_ = 1;
    parse_length(element,0x17,(length_t *)&it,false,false);
    if ((it._0_4_ == 0.0) && (!NAN(it._0_4_))) {
      return;
    }
    x = 0.0;
    lStack_10c = length_type_fixed;
    x_1.value = 0.0;
    x_1.type = length_type_fixed;
    parse_length(element,5,(length_t *)&x,true,false);
    parse_length(element,6,&x_1,true,false);
    fVar14 = x;
    if (lStack_10c == length_type_percent) {
      fVar14 = (state->view_width * x) / 100.0;
    }
    local_108 = ZEXT416((uint)fVar14);
    fVar14 = x_1.value;
    if (x_1.type == length_type_percent) {
      fVar14 = (state->view_height * x_1.value) / 100.0;
    }
    local_f8 = ZEXT416((uint)fVar14);
    fVar14 = resolve_length(state,(length_t *)&it,'o');
    render_state_begin(element,&new_state,state);
    new_state.extents.y = (float)local_f8._0_4_ - fVar14;
    new_state.extents.x = (float)local_108._0_4_ - fVar14;
    new_state.extents.h = fVar14 + fVar14;
    new_state.extents.w = fVar14 + fVar14;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_circle
              (context->document->path,(float)local_108._0_4_,(float)local_f8._0_4_,fVar14);
    break;
  default:
    goto switchD_001045e6_caseD_2;
  case 4:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    it._0_4_ = 0.0;
    it._4_4_ = 1;
    x = 0.0;
    lStack_10c = length_type_fixed;
    parse_length(element,0x18,(length_t *)&it,false,false);
    parse_length(element,0x19,(length_t *)&x,false,false);
    if ((it._0_4_ == 0.0) && (!NAN(it._0_4_))) {
      return;
    }
    local_f8 = ZEXT416((uint)x);
    if ((x == 0.0) && (!NAN(x))) {
      return;
    }
    local_108 = ZEXT416((uint)it._0_4_);
    x_1.value = 0.0;
    x_1.type = length_type_fixed;
    y.value = 0.0;
    y.type = length_type_fixed;
    parse_length(element,5,&x_1,true,false);
    parse_length(element,6,&y,true,false);
    fVar14 = x_1.value;
    if (x_1.type == length_type_percent) {
      fVar14 = (state->view_width * x_1.value) / 100.0;
    }
    fVar15 = y.value;
    if (y.type == length_type_percent) {
      fVar15 = (state->view_height * y.value) / 100.0;
    }
    if (it._4_4_ == 2) {
      local_108._0_4_ = ((float)local_108._0_4_ * state->view_width) / 100.0;
    }
    if (lStack_10c == length_type_percent) {
      local_f8._0_4_ = ((float)local_f8._0_4_ * state->view_height) / 100.0;
    }
    render_state_begin(element,&new_state,state);
    fVar11 = local_108._0_4_;
    auVar3._4_4_ = fVar11;
    auVar3._0_4_ = fVar15;
    auVar3._8_4_ = local_f8._0_4_;
    auVar2._4_8_ = auVar3._4_8_;
    auVar2._0_4_ = fVar15 + fVar15;
    auVar18._0_8_ = auVar2._0_8_ << 0x20;
    auVar18._8_4_ = fVar11 + fVar11;
    auVar18._12_4_ = (float)local_f8._0_4_ + (float)local_f8._0_4_;
    new_state.extents.y = fVar15 - (float)local_f8._0_4_;
    new_state.extents.x = fVar14 - fVar11;
    new_state.extents._8_8_ = auVar18._8_8_;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_ellipse
              (context->document->path,fVar14,fVar15,(float)local_108._0_4_,(float)local_f8._0_4_);
    break;
  case 5:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    render_state_begin(element,&new_state,state);
    render_children(element,context,&new_state);
    goto LAB_00104dd9;
  case 6:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    x_1.value = 0.0;
    x_1.type = length_type_fixed;
    y.value = 0.0;
    y.type = length_type_fixed;
    parse_length(element,0x29,&x_1,false,false);
    parse_length(element,0x10,&y,false,false);
    if ((x_1.value == 0.0) && (!NAN(x_1.value))) {
      return;
    }
    if ((y.value == 0.0) && (!NAN(y.value))) {
      return;
    }
    local_108._0_4_ = x_1.value;
    local_f8._0_4_ = y.value;
    rx.value = 0.0;
    rx.type = length_type_fixed;
    ry.value = 0.0;
    ry.type = length_type_fixed;
    parse_length(element,0x2a,&rx,true,false);
    parse_length(element,0x2d,&ry,true,false);
    local_d8 = rx.value;
    if (rx.type == length_type_percent) {
      local_d8 = (state->view_width * rx.value) / 100.0;
    }
    local_c8 = ry.value;
    if (ry.type == length_type_percent) {
      local_c8 = (state->view_height * ry.value) / 100.0;
    }
    if (x_1.type == length_type_percent) {
      local_108._0_4_ = ((float)local_108._0_4_ * state->view_width) / 100.0;
    }
    if (y.type == length_type_percent) {
      local_f8._0_4_ = ((float)local_f8._0_4_ * state->view_height) / 100.0;
    }
    render_state_begin(element,&new_state,state);
    new_state.extents.y = local_c8;
    new_state.extents.x = local_d8;
    new_state.extents.h = (float)local_f8._0_4_;
    new_state.extents.w = (float)local_108._0_4_;
    if ((new_state.mode != render_mode_bounding) &&
       (psVar7 = find_attribute(element,0x11,false), psVar7 != (string_t *)0x0)) {
      pcVar10 = psVar7->data;
      it._0_4_ = SUB84(pcVar10,0);
      it._4_4_ = (int)((ulong)pcVar10 >> 0x20);
      pcVar10 = pcVar10 + psVar7->length;
      _Var5 = skip_string(&it,pcVar10,"data:image/png");
      if ((((_Var5) ||
           ((_Var5 = skip_string(&it,pcVar10,"data:image/jpg"), _Var5 ||
            (_Var5 = skip_string(&it,pcVar10,"data:image/jpeg"), _Var5)))) &&
          (_Var5 = skip_string(&it,pcVar10,";base64,"), _Var5)) &&
         (surface = plutovg_surface_load_from_image_base64
                              ((char *)CONCAT44(it._4_4_,it._0_4_),(int)pcVar10 - (int)it._0_4_),
         surface != (plutovg_surface_t *)0x0)) {
        iVar6 = plutovg_surface_get_width(surface);
        fVar11 = (float)iVar6;
        iVar6 = plutovg_surface_get_height(surface);
        fVar12 = (float)iVar6;
        x = 7.00649e-45;
        lStack_10c = length_type_unknown;
        parse_view_position(element,(int)&x,position);
        fVar13 = 0.0;
        fVar14 = (float)local_108._0_4_;
        local_8c = (float)local_f8._0_4_;
        fVar15 = fVar12;
        local_b8 = fVar11;
        if (x == 0.0) goto LAB_00105544;
        if (lStack_10c == length_type_fixed) {
          fVar19 = 0.0;
          fVar13 = 0.0;
          if ((float)local_f8._0_4_ < (float)local_108._0_4_ * (fVar12 / fVar11)) {
            fVar15 = (fVar11 / (float)local_108._0_4_) * (float)local_f8._0_4_;
            if ((int)x - 7U < 3) {
              fVar13 = fVar12 - fVar15;
            }
            else if ((int)x - 4U < 3) {
              fVar13 = (fVar12 - fVar15) * 0.5 + 0.0;
            }
          }
          if (((float)local_108._0_4_ < (float)local_f8._0_4_ / (fVar12 / fVar11)) &&
             (local_b8 = (fVar12 / (float)local_f8._0_4_) * (float)local_108._0_4_, (uint)x < 10)) {
            if ((0x124U >> ((uint)x & 0x1f) & 1) == 0) {
              if ((0x248U >> ((uint)x & 0x1f) & 1) != 0) {
                fVar19 = fVar11 - local_b8;
              }
            }
            else {
              fVar19 = (fVar11 - local_b8) * 0.5 + 0.0;
            }
          }
        }
        else if (lStack_10c == length_type_unknown) {
          fVar19 = (float)local_108._0_4_ * (fVar12 / fVar11);
          if (fVar19 < (float)local_f8._0_4_) {
            local_8c = fVar19;
            if ((int)x - 7U < 3) {
              local_c8 = local_c8 + ((float)local_f8._0_4_ - fVar19);
            }
            else if ((int)x - 4U < 3) {
              local_c8 = local_c8 + ((float)local_f8._0_4_ - fVar19) * 0.5;
            }
          }
          fVar11 = (float)local_f8._0_4_ / (fVar12 / fVar11);
          if ((fVar11 < (float)local_108._0_4_) && (fVar14 = fVar11, (uint)x < 10)) {
            if ((0x124U >> ((uint)x & 0x1f) & 1) == 0) {
              if ((0x248U >> ((uint)x & 0x1f) & 1) == 0) goto LAB_00105544;
              fVar11 = (float)local_108._0_4_ - fVar11;
            }
            else {
              fVar11 = ((float)local_108._0_4_ - fVar11) * 0.5;
            }
            local_d8 = local_d8 + fVar11;
          }
LAB_00105544:
          fVar19 = 0.0;
        }
        else {
          fVar19 = 0.0;
        }
        local_f8._0_4_ = fVar14;
        local_108._0_4_ = local_8c;
        it._0_4_ = fVar14 / local_b8;
        local_8c = local_8c / fVar15;
        it._4_4_ = 0;
        fStack_90 = 0.0;
        local_88 = -fVar19 * it._0_4_;
        local_84 = -fVar13 * local_8c;
        plutovg_canvas_set_fill_rule(context->canvas,PLUTOVG_FILL_RULE_NON_ZERO);
        plutovg_canvas_set_opacity(context->canvas,new_state.opacity);
        plutovg_canvas_set_matrix(context->canvas,&new_state.matrix);
        plutovg_canvas_translate(context->canvas,local_d8,local_c8);
        plutovg_canvas_set_texture
                  (context->canvas,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,(plutovg_matrix_t *)&it);
        plutovg_canvas_fill_rect
                  (context->canvas,0.0,0.0,(float)local_f8._0_4_,(float)local_108._0_4_);
        plutovg_surface_destroy(surface);
      }
    }
    goto LAB_00104dd9;
  case 7:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    local_108._0_8_ = context;
    it._0_4_ = 0.0;
    it._4_4_ = 1;
    x = 0.0;
    lStack_10c = length_type_fixed;
    x_1.value = 0.0;
    x_1.type = length_type_fixed;
    y.value = 0.0;
    y.type = length_type_fixed;
    parse_length(element,0x2b,(length_t *)&it,true,false);
    parse_length(element,0x2e,(length_t *)&x,true,false);
    parse_length(element,0x2c,&x_1,true,false);
    parse_length(element,0x2f,&y,true,false);
    fVar14 = it._0_4_;
    if (it._4_4_ == 2) {
      fVar14 = (state->view_width * it._0_4_) / 100.0;
    }
    local_f8 = ZEXT416((uint)fVar14);
    context = (render_context_t *)local_108._0_8_;
    fVar14 = x;
    if (lStack_10c == length_type_percent) {
      fVar14 = (state->view_height * x) / 100.0;
    }
    fVar15 = x_1.value;
    if (x_1.type == length_type_percent) {
      fVar15 = (state->view_width * x_1.value) / 100.0;
    }
    fVar11 = y.value;
    if (y.type == length_type_percent) {
      fVar11 = (state->view_height * y.value) / 100.0;
    }
    render_state_begin(element,&new_state,state);
    auVar16._4_4_ = fVar14;
    auVar16._0_4_ = local_f8._0_4_;
    auVar16._8_4_ = local_f8._4_4_;
    auVar16._12_4_ = 0;
    auVar17._4_4_ = fVar11;
    auVar17._0_4_ = fVar15;
    auVar17._8_8_ = 0;
    auVar17 = minps(auVar16,auVar17);
    new_state.extents._8_8_ =
         CONCAT44(fVar11 - fVar14,fVar15 - (float)local_f8._0_4_) & 0x7fffffff7fffffff;
    new_state.extents._0_8_ = auVar17._0_8_;
    plutovg_path_reset((*&context->document)->path);
    plutovg_path_move_to((*&context->document)->path,(float)local_f8._0_4_,fVar14);
    plutovg_path_line_to((*&context->document)->path,fVar15,fVar11);
    break;
  case 9:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    render_state_begin(element,&new_state,state);
    plutovg_path_reset(context->document->path);
    psVar7 = find_attribute(element,7,false);
    if (psVar7 != (string_t *)0x0) {
      plutovg_path_parse(context->document->path,psVar7->data,(int)psVar7->length);
    }
    path = context->document->path;
    goto LAB_00104db9;
  case 10:
  case 0xb:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    render_state_begin(element,&new_state,state);
    plutovg_path_reset(context->document->path);
    path = context->document->path;
    psVar7 = find_attribute(element,0x15,false);
    if (psVar7 != (string_t *)0x0) {
      local_108._0_8_ = context;
      pcVar10 = psVar7->data;
      it._0_4_ = SUB84(pcVar10,0);
      it._4_4_ = (int)((ulong)pcVar10 >> 0x20);
      end = pcVar10 + psVar7->length;
      bVar9 = true;
      while (pcVar10 < end) {
        _Var5 = parse_float(&it,end,&x);
        if (((!_Var5) || (_Var5 = skip_ws_comma(&it,end), !_Var5)) ||
           (_Var5 = parse_float(&it,end,&x_1.value), !_Var5)) goto LAB_00104da1;
        skip_ws_comma(&it,end);
        if (bVar9) {
          plutovg_path_move_to(path,x,x_1.value);
        }
        else {
          plutovg_path_line_to(path,x,x_1.value);
        }
        bVar9 = false;
        pcVar10 = (char *)CONCAT44(it._4_4_,it._0_4_);
      }
      if (element->id == 10) {
        plutovg_path_close(path);
      }
LAB_00104da1:
      path = (*(plutosvg_document_t **)local_108._0_8_)->path;
      context = (render_context_t *)local_108._0_8_;
    }
LAB_00104db9:
    plutovg_path_extents(path,&new_state.extents,false);
    break;
  case 0xd:
    _Var5 = is_display_none(element);
    if (_Var5) {
      return;
    }
    _Var5 = is_visibility_hidden(element);
    if (_Var5) {
      return;
    }
    it._0_4_ = 0.0;
    it._4_4_ = 1;
    x = 0.0;
    lStack_10c = length_type_fixed;
    parse_length(element,0x29,(length_t *)&it,false,false);
    parse_length(element,0x10,(length_t *)&x,false,false);
    if ((it._0_4_ == 0.0) && (!NAN(it._0_4_))) {
      return;
    }
    local_f8._0_4_ = x;
    if ((x == 0.0) && (!NAN(x))) {
      return;
    }
    local_108._0_4_ = it._0_4_;
    x_1.value = 0.0;
    x_1.type = length_type_fixed;
    y.value = 0.0;
    y.type = length_type_fixed;
    parse_length(element,0x2a,&x_1,true,false);
    parse_length(element,0x2d,&y,true,false);
    fVar14 = x_1.value;
    if (x_1.type == length_type_percent) {
      fVar14 = (state->view_width * x_1.value) / 100.0;
    }
    fVar15 = y.value;
    if (y.type == length_type_percent) {
      fVar15 = (state->view_height * y.value) / 100.0;
    }
    if (it._4_4_ == 2) {
      local_108._0_4_ = ((float)local_108._0_4_ * state->view_width) / 100.0;
    }
    if (lStack_10c == length_type_percent) {
      local_f8._0_4_ = ((float)local_f8._0_4_ * state->view_height) / 100.0;
    }
    rx.value = 0.0;
    rx.type = length_type_unknown;
    ry.value = 0.0;
    ry.type = length_type_unknown;
    parse_length(element,0x18,&rx,false,false);
    parse_length(element,0x19,&ry,false,false);
    fVar11 = rx.value;
    if (rx.type == length_type_percent) {
      fVar11 = (state->view_width * rx.value) / 100.0;
    }
    fVar12 = ry.value;
    if (ry.type == length_type_percent) {
      fVar12 = (state->view_height * ry.value) / 100.0;
    }
    fVar13 = fVar12;
    if (rx.type != length_type_unknown) {
      fVar13 = fVar11;
    }
    fVar11 = fVar13;
    if (ry.type != length_type_unknown) {
      fVar11 = fVar12;
    }
    render_state_begin(element,&new_state,state);
    new_state.extents.y = fVar15;
    new_state.extents.x = fVar14;
    new_state.extents.h = (float)local_f8._0_4_;
    new_state.extents.w = (float)local_108._0_4_;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_round_rect
              (context->document->path,fVar14,fVar15,(float)local_108._0_4_,(float)local_f8._0_4_,
               fVar13,fVar11);
    break;
  case 0xf:
    render_svg(element,context,state);
    return;
  case 0x11:
    _Var5 = is_display_none(element);
    prVar8 = state;
    if (_Var5) {
      return;
    }
    do {
      if (prVar8->element == element) {
        return;
      }
      pprVar4 = &prVar8->parent;
      prVar8 = *pprVar4;
    } while (*pprVar4 != (render_state *)0x0);
    element_00 = resolve_href(context->document,element);
    if (element_00 == (element_t *)0x0) {
      return;
    }
    local_108._0_8_ = context;
    it._0_4_ = 0.0;
    it._4_4_ = 1;
    x = 0.0;
    lStack_10c = length_type_fixed;
    parse_length(element,0x2a,(length_t *)&it,true,false);
    parse_length(element,0x2d,(length_t *)&x,true,false);
    local_f8._0_4_ = it._0_4_;
    if (it._4_4_ == 2) {
      local_f8._0_4_ = (state->view_width * it._0_4_) / 100.0;
    }
    context_00 = local_108._0_8_;
    fVar14 = x;
    if (lStack_10c == length_type_percent) {
      fVar14 = (state->view_height * x) / 100.0;
    }
    render_state_begin(element,&new_state,state);
    plutovg_matrix_translate(&new_state.matrix,(float)local_f8._0_4_,fVar14);
    peVar1 = element_00->parent;
    element_00->parent = element;
    if (element_00->id - 0xfU < 2) {
      render_svg(element_00,(render_context_t *)context_00,&new_state);
    }
    else {
      render_element(element_00,(render_context_t *)context_00,&new_state);
    }
    element_00->parent = peVar1;
    goto LAB_00104dd9;
  }
  draw_shape(element,context,&new_state);
LAB_00104dd9:
  render_state_end(&new_state);
switchD_001045e6_caseD_2:
  return;
}

Assistant:

static void render_element(const element_t* element, const render_context_t* context, render_state_t* state)
{
    switch(element->id) {
    case TAG_SVG:
        render_svg(element, context, state);
        break;
    case TAG_USE:
        render_use(element, context, state);
        break;
    case TAG_G:
        render_g(element, context, state);
        break;
    case TAG_LINE:
        render_line(element, context, state);
        break;
    case TAG_ELLIPSE:
        render_ellipse(element, context, state);
        break;
    case TAG_CIRCLE:
        render_circle(element, context, state);
        break;
    case TAG_RECT:
        render_rect(element, context, state);
        break;
    case TAG_POLYLINE:
    case TAG_POLYGON:
        render_poly(element, context, state);
        break;
    case TAG_PATH:
        render_path(element, context, state);
        break;
    case TAG_IMAGE:
        render_image(element, context, state);
        break;
    }
}